

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O2

void __thiscall Node::~Node(Node *this)

{
  ~Node(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

virtual ~Node() = default;